

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzrot::VariablesQbSetSpeed(ChNodeFEAxyzrot *this,double step)

{
  undefined1 *puVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  ChVector<double> v;
  double local_f8;
  double dStack_f0;
  double dStack_e8;
  ChVectorRef *pCStack_e0;
  undefined8 local_d8;
  long local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  double local_a8;
  double dStack_a0;
  double dStack_98;
  double dStack_90;
  double local_88;
  long local_80;
  ChVector<double> local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  local_b8 = *(undefined8 *)&this->field_0xa0;
  uStack_b0 = *(undefined8 *)&this->field_0xa8;
  dVar2 = *(double *)&this->field_0xb0;
  local_58 = *(undefined8 *)&this->field_0xb8;
  uStack_50 = *(undefined8 *)&this->field_0xc0;
  uStack_48 = *(undefined8 *)&this->field_0xc8;
  uStack_40 = *(undefined8 *)&this->field_0xd0;
  local_a8 = step;
  ChVariables::Get_qb((ChVectorRef *)&local_88,(ChVariables *)&this->variables);
  local_f8 = local_88;
  dStack_f0 = 1.48219693752374e-323;
  local_d8 = 0;
  local_c8 = local_80;
  if (2 < local_80) {
    puVar1 = &(this->super_ChNodeFEAbase).field_0x18;
    pCStack_e0 = (ChVectorRef *)&local_88;
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_70,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_f8,(type *)0x0);
    (**(code **)(*(long *)puVar1 + 0x38))(puVar1,&local_70);
    ChVariables::Get_qb((ChVectorRef *)&local_88,(ChVariables *)&this->variables);
    local_f8 = (double)((long)local_88 + 0x18);
    dStack_f0 = 1.48219693752374e-323;
    local_d8 = 3;
    local_c8 = local_80;
    if (5 < local_80) {
      pCStack_e0 = (ChVectorRef *)&local_88;
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_70,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)&local_f8,(type *)0x0);
      (**(code **)(*(long *)puVar1 + 0x48))(puVar1,&local_70);
      if ((local_a8 != 0.0) || (NAN(local_a8))) {
        local_a8 = 1.0 / local_a8;
        auVar3._8_8_ = uStack_b0;
        auVar3._0_8_ = local_b8;
        auVar3 = vsubpd_avx(*(undefined1 (*) [16])&this->field_0xa0,auVar3);
        dStack_e8 = local_a8 * (*(double *)&this->field_0xb0 - dVar2);
        local_f8 = local_a8 * auVar3._0_8_;
        dStack_f0 = local_a8 * auVar3._8_8_;
        dStack_a0 = local_a8;
        dStack_98 = local_a8;
        dStack_90 = local_a8;
        (**(code **)(*(long *)&(this->super_ChNodeFEAbase).field_0x18 + 0x60))(puVar1,&local_f8);
        auVar4._8_8_ = uStack_50;
        auVar4._0_8_ = local_58;
        auVar4._16_8_ = uStack_48;
        auVar4._24_8_ = uStack_40;
        auVar4 = vsubpd_avx(*(undefined1 (*) [32])&this->field_0xb8,auVar4);
        local_f8 = auVar4._0_8_ * local_a8;
        dStack_f0 = auVar4._8_8_ * dStack_a0;
        dStack_e8 = auVar4._16_8_ * dStack_98;
        pCStack_e0 = (ChVectorRef *)(auVar4._24_8_ * dStack_90);
        (**(code **)(*(long *)&(this->super_ChNodeFEAbase).field_0x18 + 0x68))(puVar1,&local_f8);
      }
      return;
    }
  }
  dStack_f0 = 1.48219693752374e-323;
  pCStack_e0 = (ChVectorRef *)&local_88;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzrot::VariablesQbSetSpeed(double step) {
    ChCoordsys<> old_coord_dt = this->GetCoord_dt();

    // from 'qb' vector, sets body speed, and updates auxiliary data
    this->SetPos_dt(this->variables.Get_qb().segment(0, 3));
    this->SetWvel_loc(this->variables.Get_qb().segment(3, 3));

    // apply limits (if in speed clamping mode) to speeds.
    // ClampSpeed();

    // Compute accel. by BDF (approximate by differentiation);
    if (step) {
        this->SetPos_dtdt((this->GetCoord_dt().pos - old_coord_dt.pos) / step);
        this->SetRot_dtdt((this->GetCoord_dt().rot - old_coord_dt.rot) / step);
    }
}